

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siphash.cc
# Opt level: O2

uint64_t SIPHASH_24(uint64_t *key,uint8_t *input,size_t input_len)

{
  ulong uVar1;
  size_t __n;
  uint8_t last_block [8];
  undefined8 local_50;
  ulong local_48;
  uint uStack_40;
  uint uStack_3c;
  uint local_38;
  uint uStack_34;
  ulong uStack_30;
  
  uStack_40 = (uint)key[1] ^ 0x6e646f6d;
  uStack_3c = *(uint *)((long)key + 0xc) ^ 0x646f7261;
  local_38 = (uint)*key ^ 0x6e657261;
  uStack_34 = *(uint *)((long)key + 4) ^ 0x6c796765;
  uStack_30 = key[1] ^ 0x7465646279746573;
  local_48 = *key ^ 0x736f6d6570736575;
  for (__n = input_len; 7 < __n; __n = __n - 8) {
    uVar1 = *(ulong *)input;
    uStack_30 = uStack_30 ^ uVar1;
    siphash_round(&local_48);
    siphash_round(&local_48);
    local_48 = local_48 ^ uVar1;
    input = (uint8_t *)((long)input + 8);
  }
  local_50 = 0;
  if (__n != 0) {
    memcpy(&local_50,input,__n);
  }
  local_50 = CONCAT17((char)input_len,(undefined7)local_50);
  uVar1 = local_50;
  uStack_30 = uStack_30 ^ local_50;
  siphash_round(&local_48);
  siphash_round(&local_48);
  local_48 = local_48 ^ uVar1;
  local_38 = CONCAT31(local_38._1_3_,~(byte)local_38);
  siphash_round(&local_48);
  siphash_round(&local_48);
  siphash_round(&local_48);
  siphash_round(&local_48);
  return CONCAT44(uStack_3c,uStack_40) ^ uStack_30 ^ local_48 ^ CONCAT44(uStack_34,local_38);
}

Assistant:

uint64_t SIPHASH_24(const uint64_t key[2], const uint8_t *input,
                    size_t input_len) {
  const size_t orig_input_len = input_len;

  uint64_t v[4];
  v[0] = key[0] ^ UINT64_C(0x736f6d6570736575);
  v[1] = key[1] ^ UINT64_C(0x646f72616e646f6d);
  v[2] = key[0] ^ UINT64_C(0x6c7967656e657261);
  v[3] = key[1] ^ UINT64_C(0x7465646279746573);

  while (input_len >= sizeof(uint64_t)) {
    uint64_t m = CRYPTO_load_u64_le(input);
    v[3] ^= m;
    siphash_round(v);
    siphash_round(v);
    v[0] ^= m;

    input += sizeof(uint64_t);
    input_len -= sizeof(uint64_t);
  }

  uint8_t last_block[8];
  OPENSSL_memset(last_block, 0, sizeof(last_block));
  OPENSSL_memcpy(last_block, input, input_len);
  last_block[7] = orig_input_len & 0xff;

  uint64_t last_block_word = CRYPTO_load_u64_le(last_block);
  v[3] ^= last_block_word;
  siphash_round(v);
  siphash_round(v);
  v[0] ^= last_block_word;

  v[2] ^= 0xff;
  siphash_round(v);
  siphash_round(v);
  siphash_round(v);
  siphash_round(v);

  return v[0] ^ v[1] ^ v[2] ^ v[3];
}